

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CAdES.h
# Opt level: O0

size_t __thiscall TBSCertificate::SetDataSize(TBSCertificate *this)

{
  size_t sVar1;
  size_t sVar2;
  size_t sVar3;
  size_t sVar4;
  size_t sVar5;
  size_t sVar6;
  size_t sVar7;
  size_t sVar8;
  size_t sVar9;
  size_t sVar10;
  size_t cbExtensions;
  size_t cbSubjectId;
  size_t cbIssuerId;
  size_t cbPublicKey;
  size_t cbSubject;
  size_t cbValidity;
  size_t cbIssuer;
  size_t cbSignature;
  size_t cbSerial;
  size_t cbVersion;
  TBSCertificate *this_local;
  
  sVar1 = ContextSpecificHolder<Integer,_(unsigned_char)'\xa0',_(OptionType)1>::EncodedSize
                    (&this->version);
  sVar2 = DerBase::EncodedSize(&(this->serialNumber).super_DerBase);
  sVar3 = DerBase::EncodedSize(&(this->signature).super_DerBase);
  sVar4 = Name::EncodedSize(&this->issuer);
  sVar5 = DerBase::EncodedSize(&(this->validity).super_DerBase);
  sVar6 = Name::EncodedSize(&this->subject);
  sVar7 = DerBase::EncodedSize(&(this->subjectPublicKeyInfo).super_DerBase);
  sVar8 = ContextSpecificHolder<BitString,_(unsigned_char)'\x81',_(OptionType)0>::EncodedSize
                    (&this->issuerUniqueID);
  sVar9 = ContextSpecificHolder<BitString,_(unsigned_char)'\x82',_(OptionType)0>::EncodedSize
                    (&this->subjectUniqueID);
  sVar10 = ContextSpecificHolder<Extensions,_(unsigned_char)'\xa3',_(OptionType)1>::EncodedSize
                     (&this->extensions);
  (this->super_DerBase).cbData =
       sVar1 + sVar2 + sVar3 + sVar4 + sVar5 + sVar6 + sVar7 + sVar8 + sVar9 + sVar10;
  return (this->super_DerBase).cbData;
}

Assistant:

virtual size_t SetDataSize() override
	{
        // To facilitate debugging
        size_t cbVersion = version.EncodedSize();
        size_t cbSerial = serialNumber.EncodedSize();
        size_t cbSignature = signature.EncodedSize();
        size_t cbIssuer = issuer.EncodedSize();
        size_t cbValidity = validity.EncodedSize();
        size_t cbSubject = subject.EncodedSize();
        size_t cbPublicKey = subjectPublicKeyInfo.EncodedSize();
        size_t cbIssuerId = issuerUniqueID.EncodedSize();
        size_t cbSubjectId = subjectUniqueID.EncodedSize();
        size_t cbExtensions = extensions.EncodedSize();

		cbData =
			cbVersion +
			cbSerial +
			cbSignature +
			cbIssuer +
			cbValidity + 
			cbSubject + 
			cbPublicKey +
			cbIssuerId +
			cbSubjectId +
			cbExtensions;

		return cbData;
	}